

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_ClosedEnumError_Test::
~PhpGeneratorTest_ClosedEnumError_Test(PhpGeneratorTest_ClosedEnumError_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, ClosedEnumError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    enum Foo {
      BAR = 0;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring("Can't generate PHP code for closed enum Foo");
}